

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

void Wlc_NtkExploreMem(Wlc_Ntk_t *p,int nFrames)

{
  Wlc_Obj_t *pObj;
  int iVar1;
  int iVar2;
  uint iObj;
  Vec_Int_t *vCollect;
  int *piVar3;
  Vec_Int_t *__ptr;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  
  vCollect = (Vec_Int_t *)malloc(0x10);
  vCollect->nCap = 1000;
  vCollect->nSize = 0;
  piVar3 = (int *)malloc(4000);
  vCollect->pArray = piVar3;
  vCollect->nSize = 1000;
  if (piVar3 != (int *)0x0) {
    memset(piVar3,0,4000);
  }
  __ptr = Wlc_NtkCollectMemory(p,1);
  Wlc_NtkCleanMarks(p);
  iVar1 = __ptr->nSize;
  lVar7 = (long)iVar1;
  if (0 < lVar7) {
    piVar3 = __ptr->pArray;
    lVar6 = 0;
    do {
      iVar2 = piVar3[lVar6];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_00362892;
      *(ushort *)(p->pObjs + iVar2) = *(ushort *)(p->pObjs + iVar2) | 0x80;
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  if (0 < iVar1) {
    piVar3 = __ptr->pArray;
    lVar6 = 0;
    do {
      lVar4 = (long)piVar3[lVar6];
      if ((lVar4 < 1) || (p->nObjsAlloc <= piVar3[lVar6])) {
LAB_00362892:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar4] & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x36) {
        pObj = p->pObjs + lVar4;
        vCollect->nSize = 0;
        Wlc_NtkExploreMem_rec(p,pObj,vCollect,nFrames);
        printf("Read port %6d : ",
               (ulong)(uint)((int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555));
        printf("Inputs = %6d  ",(ulong)(uint)vCollect->nSize);
        if (0 < vCollect->nSize) {
          lVar4 = 0;
          do {
            iObj = vCollect->pArray[lVar4];
            pcVar5 = Wlc_ObjName(p,iObj);
            printf("%d(%s) ",(ulong)iObj,pcVar5);
            lVar4 = lVar4 + 1;
          } while (lVar4 < vCollect->nSize);
        }
        putchar(10);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar7);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (vCollect->pArray != (int *)0x0) {
    free(vCollect->pArray);
    vCollect->pArray = (int *)0x0;
  }
  free(vCollect);
  Wlc_NtkCleanMarks(p);
  return;
}

Assistant:

void Wlc_NtkExploreMem( Wlc_Ntk_t * p, int nFrames )
{
    Wlc_Obj_t * pObj; int i, k, iObj;
    Vec_Int_t * vCollect = Vec_IntStart( 1000 );
    Vec_Int_t * vMemObjsClean = Wlc_NtkCollectMemory( p, 1 );
    Wlc_NtkCleanMarks( p );
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
        pObj->Mark = 1;
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) != WLC_OBJ_READ )
            continue;
        Vec_IntClear( vCollect );
        Wlc_NtkExploreMem_rec( p, pObj, vCollect, nFrames );
        printf( "Read port %6d : ", Wlc_ObjId(p, pObj) );
        printf( "Inputs = %6d  ", Vec_IntSize(vCollect) );
        Vec_IntForEachEntry( vCollect, iObj, k )
            printf( "%d(%s) ", iObj, Wlc_ObjName(p, iObj) );
        printf( "\n" );
    }
    Vec_IntFree( vMemObjsClean );
    Vec_IntFree( vCollect );
    Wlc_NtkCleanMarks( p );
}